

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_address-inl.h
# Opt level: O3

bool anon_unknown.dwarf_4a0c::CheckAddressPipes(uintptr_t addr,int pagesize)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  undefined8 uVar4;
  char *pcVar5;
  bool bVar6;
  long lVar7;
  bool bVar8;
  SpinLockHolder local_138;
  char drainbuf [256];
  
  if (CheckAddressPipes::once.done_flag_ != 1) {
    local_138.lock_ = (SpinLock *)&CheckAddressPipes::once.lock_storage_;
    LOCK();
    bVar8 = CheckAddressPipes::once.lock_storage_.bytes_ == (uint8_t  [4])0x0;
    if (bVar8) {
      CheckAddressPipes::once.lock_storage_.bytes_[0] = '\x01';
      CheckAddressPipes::once.lock_storage_.bytes_[1] = '\0';
      CheckAddressPipes::once.lock_storage_.bytes_[2] = '\0';
      CheckAddressPipes::once.lock_storage_.bytes_[3] = '\0';
    }
    UNLOCK();
    if (!bVar8) {
      SpinLock::SlowLock((SpinLock *)&CheckAddressPipes::once.lock_storage_);
    }
    if (CheckAddressPipes::once.done_flag_ != 1) {
      iVar1 = pipe(CheckAddressPipes::fds);
      if (iVar1 != 0) {
        pcVar5 = "Check failed: pipe(fds) == 0: pipe(fds)\n";
        uVar4 = 0x28;
        goto LAB_001092a5;
      }
      lVar7 = 0;
      bVar8 = true;
      do {
        bVar6 = bVar8;
        iVar1 = CheckAddressPipes::fds[lVar7];
        uVar2 = fcntl(iVar1,1,0);
        if ((int)uVar2 < 0) {
LAB_001092c9:
          pcVar5 = "Check failed: flags >= 0: fcntl get\n";
          uVar4 = 0x24;
          goto LAB_001092a5;
        }
        iVar1 = fcntl(iVar1,2,(ulong)(uVar2 | 1));
        if (iVar1 != 0) {
LAB_001092b6:
          pcVar5 = "Check failed: fcntl(fd, set, flags) == 0: fcntl set\n";
          uVar4 = 0x34;
          goto LAB_001092a5;
        }
        iVar1 = CheckAddressPipes::fds[lVar7];
        uVar2 = fcntl(iVar1,3,0);
        if ((int)uVar2 < 0) goto LAB_001092c9;
        iVar1 = fcntl(iVar1,4,(ulong)(uVar2 | 0x800));
        if (iVar1 != 0) goto LAB_001092b6;
        lVar7 = 1;
        bVar8 = false;
      } while (bVar6);
      CheckAddressPipes::once.done_flag_ = 1;
    }
    SpinLockHolder::~SpinLockHolder(&local_138);
  }
  lVar7 = syscall(1,(ulong)(uint)CheckAddressPipes::fds[1],addr,1);
  if ((int)lVar7 != 0) {
    do {
      if (0 < (int)lVar7) {
LAB_0010927c:
        return 0 < (int)lVar7;
      }
      piVar3 = __errno_location();
      if (*piVar3 != 0xb) {
        if (*piVar3 == 0xe) goto LAB_0010927c;
        pcVar5 = "Check failed: errno == EAGAIN: write errno must be EAGAIN\n";
        uVar4 = 0x3a;
        goto LAB_001092a5;
      }
      do {
        do {
          lVar7 = syscall(0,(ulong)(uint)CheckAddressPipes::fds[0],&local_138,0x100);
        } while (-1 < (int)lVar7);
      } while (*piVar3 == 4);
      if (*piVar3 != 0xb) {
        pcVar5 = "Check failed: errno == EAGAIN: read errno must be EAGAIN\n";
        uVar4 = 0x39;
        goto LAB_001092a5;
      }
      lVar7 = syscall(1,(ulong)(uint)CheckAddressPipes::fds[1],addr,1);
    } while ((int)lVar7 != 0);
  }
  pcVar5 = "Check failed: rv != 0: raw_write(...) == 0\n";
  uVar4 = 0x2b;
LAB_001092a5:
  syscall(1,2,pcVar5,uVar4);
  abort();
}

Assistant:

bool CheckAddress(uintptr_t addr, int pagesize) {
  static tcmalloc::TrivialOnce once;
  static int fds[2];

  once.RunOnce([] () {
    RAW_CHECK(pipe(fds) == 0, "pipe(fds)");

    auto add_flag = [] (int fd, int get, int set, int the_flag) {
      int flags = fcntl(fd, get, 0);
      RAW_CHECK(flags >= 0, "fcntl get");
      flags |= the_flag;
      RAW_CHECK(fcntl(fd, set, flags) == 0, "fcntl set");
    };

    for (int i = 0; i < 2; i++) {
      add_flag(fds[i], F_GETFD, F_SETFD, FD_CLOEXEC);
      add_flag(fds[i], F_GETFL, F_SETFL, O_NONBLOCK);
    }
  });

  do {
    int rv = raw_write(fds[1], reinterpret_cast<void*>(addr), 1);
    RAW_CHECK(rv != 0, "raw_write(...) == 0");
    if (rv > 0) {
      return true;
    }
    if (errno == EFAULT) {
      return false;
    }

    RAW_CHECK(errno == EAGAIN, "write errno must be EAGAIN");

    char drainbuf[256];
    do {
      rv = raw_read(fds[0], drainbuf, sizeof(drainbuf));
      if (rv < 0 && errno != EINTR) {
        RAW_CHECK(errno == EAGAIN, "read errno must be EAGAIN");
        break;
      }
      // read succeeded or we got EINTR
    } while (true);
  } while (true);

  return false;
}